

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O1

Status unpack(Header *header,FILE *ifp,FILE *ofp)

{
  Byte BVar1;
  Ferror FVar2;
  Word WVar3;
  Status SVar4;
  char *fmt;
  
  WVar3 = header->complen;
  init_garble();
  crc = 0;
  running = 0;
  while ((WVar3 != 0 && (FVar2 = check_stream(ifp), FVar2 == FNOERR))) {
    BVar1 = read_byte(ifp);
    BVar1 = ungarble(BVar1);
    putc_ncr(ofp,BVar1);
    WVar3 = WVar3 - 1;
  }
  FVar2 = check_stream(ifp);
  SVar4 = RERR;
  if (FVar2 != FRWERR) {
    if ((testing == '\0') && (FVar2 = check_stream(ofp), FVar2 == FRWERR)) {
      return WERR;
    }
    SVar4 = CRCERR;
    if (header->crc == (Halfword)crc) {
      fmt = "OK (packed)";
      if (testing == '\0') {
        fmt = "unpacked";
      }
      SVar4 = NOERR;
      msg(fmt);
    }
  }
  return SVar4;
}

Assistant:

Status
unpack(Header *header, FILE *ifp, FILE *ofp)
{
	register Word len = header->complen;

    init_garble();

	crc = 0;
	putc_init();
	while (len--)
	{
		if (check_stream(ifp) != FNOERR)
			break;
		putc_ncr(ofp, ungarble(read_byte(ifp)));
	}

	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if ((Halfword) crc != header->crc)
		return (CRCERR);
	if (testing)
		msg("OK (packed)");
	else
		msg("unpacked");
	return (NOERR);
}